

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void CompareOnTheFly(comparer_context *comp)

{
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  sliced_chunk_iterator local_40;
  sliced_chunk_reader local_18;
  
  local_18.ctx = comp;
  sliced_chunk_reader::begin(&local_40,&local_18);
  do {
    if (local_40.endit != false) {
LAB_003036e9:
      sliced_chunk_iterator::~sliced_chunk_iterator(&local_40);
      return;
    }
    if (local_40.current.first == 0x1239) {
      CompareOnTheFlyScene(comp);
      goto LAB_003036e9;
    }
    sliced_chunk_iterator::operator++(&local_40);
  } while( true );
}

Assistant:

void CompareOnTheFly(comparer_context& comp)
{
    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AISCENE) {
            CompareOnTheFlyScene(comp);
            break;
        }
    }
}